

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O2

int coda_ascii_cursor_get_bit_size(coda_cursor_conflict *cursor,int64_t *bit_size)

{
  coda_native_type cVar1;
  int *piVar2;
  uint uVar3;
  undefined4 uVar4;
  char acVar5 [1];
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  coda_product_struct *pcVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  coda_type *pcVar14;
  size_t __n;
  ulong uVar15;
  char *message;
  long lVar16;
  coda_product *product;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  long *plVar20;
  uint8_t buffer_2 [1];
  int64_t bit_size_boundary;
  ulong local_398;
  ulong local_390;
  char buffer [64];
  char buffer_1 [1];
  
  pcVar14 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar14->format) {
    pcVar14 = *(coda_type **)&pcVar14->type_class;
  }
  if (-1 < pcVar14->bit_size) {
    *bit_size = pcVar14->bit_size;
    return 0;
  }
  if (pcVar14->type_class < 2) {
    iVar6 = coda_ascbin_cursor_get_bit_size(cursor,bit_size);
    return iVar6;
  }
  lVar13 = cursor->stack[(long)cursor->n + -1].bit_offset;
  lVar16 = -1;
  iVar6 = get_bit_size_boundary(cursor,&bit_size_boundary,-1);
  if (iVar6 != 0) {
    return -1;
  }
  iVar6 = pcVar14->type_class;
  if (iVar6 - 2U < 2) {
    plVar20 = (long *)pcVar14[1].description;
    if (plVar20 == (long *)0x0) {
      if (pcVar14->size_expr != (coda_expression *)0x0) goto LAB_001483e5;
      plVar20 = (long *)0x0;
    }
LAB_0014837b:
    local_398 = bit_size_boundary;
    lVar16 = 0x40;
    if (bit_size_boundary >> 3 < 0x40) {
      lVar16 = bit_size_boundary >> 3;
    }
    iVar6 = read_bytes_in_bounds(cursor->product,lVar13 >> 3,lVar16,buffer);
    if (iVar6 == 0) {
      if (plVar20 != (long *)0x0) {
        uVar3 = *(uint *)(plVar20 + 1);
        if ((int)*(uint *)(plVar20 + 1) < 1) {
          uVar3 = 0;
        }
        uVar12 = (ulong)uVar3;
        uVar15 = local_398;
        local_390 = uVar12;
        for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
          piVar2 = *(int **)(plVar20[2] + uVar18 * 8);
          iVar6 = *piVar2;
          __n = (size_t)iVar6;
          if (__n == 0) {
            if (uVar15 < 8) {
              bit_size_boundary = 0;
              goto LAB_001486a6;
            }
          }
          else if (((long)__n <= lVar16) &&
                  (iVar7 = bcmp(*(void **)(piVar2 + 2),buffer,__n), uVar15 = local_398,
                  uVar12 = local_390, iVar7 == 0)) {
            bit_size_boundary = (int64_t)(iVar6 << 3);
            goto LAB_001486a6;
          }
        }
        bit_size_boundary = *plVar20;
        if (-1 < bit_size_boundary) goto LAB_001486a6;
      }
LAB_001483e9:
      iVar6 = pcVar14->type_class;
      goto LAB_001483ec;
    }
    goto LAB_001483b4;
  }
  if (iVar6 == 4) {
    if (pcVar14->size_expr == (coda_expression *)0x0) {
      plVar20 = (long *)0x0;
      if (pcVar14[1].type_class == coda_record_class) goto LAB_001483d1;
      goto LAB_0014837b;
    }
LAB_001483e5:
    lVar16 = -1;
    goto LAB_001483e9;
  }
  if (iVar6 == 6) {
    if (pcVar14[1].format != 2) goto LAB_001483f1;
    if (*(int *)(*(long *)&pcVar14[1].type_class + 8) != 4) {
      __assert_fail("base_type->type_class == coda_text_class",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                    ,0x2be,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
    }
    if (*(int *)(*(long *)&pcVar14[1].type_class + 0x40) == 0) goto LAB_001486a6;
    goto LAB_001483e5;
  }
LAB_001483ec:
  if (iVar6 == 6) {
LAB_001483f1:
    memcpy((coda_cursor_conflict *)buffer_1,cursor,0x310);
    iVar6 = coda_cursor_use_base_type_of_special_type((coda_cursor_conflict *)buffer_1);
    if (iVar6 != 0) {
      return -1;
    }
    iVar6 = coda_cursor_get_bit_size((coda_cursor_conflict *)buffer_1,bit_size);
    return iVar6;
  }
  if (pcVar14->size_expr != (coda_expression *)0x0) {
    iVar6 = coda_expression_eval_integer(pcVar14->size_expr,cursor,bit_size);
    if (iVar6 != 0) {
      coda_add_error_message(" for size expression");
      coda_cursor_add_to_error_message(cursor);
      return -1;
    }
    lVar13 = *bit_size;
    if (pcVar14->bit_size == -8) {
      lVar13 = lVar13 << 3;
      *bit_size = lVar13;
    }
    if (lVar13 < 0) {
      coda_set_error(-300,"calculated size is negative (%ld bits)");
      coda_cursor_add_to_error_message(cursor);
      return -1;
    }
    return 0;
  }
  if (iVar6 - 2U < 2) {
    cVar1 = pcVar14->read_type;
    if (9 < (uint)cVar1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                    ,0x329,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
    }
    if ((0x55U >> (cVar1 & 0x1f) & 1) == 0) {
      if ((0xaaU >> (cVar1 & 0x1f) & 1) == 0) {
        lVar13 = coda_ascii_parse_double(buffer,lVar16,(double *)buffer_1,1);
      }
      else {
        lVar13 = coda_ascii_parse_uint64(buffer,lVar16,(uint64_t *)buffer_1,1);
      }
    }
    else {
      lVar13 = coda_ascii_parse_int64(buffer,lVar16,(int64_t *)buffer_1,1);
    }
    if (lVar13 < 0) {
      return -1;
    }
    bit_size_boundary = lVar13 << 3;
LAB_001486a6:
    *bit_size = bit_size_boundary;
    return 0;
  }
  if (iVar6 != 4) {
    __assert_fail("type->type_class == coda_text_class",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                  ,0x335,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
  }
  iVar6 = 0;
  switch(pcVar14[1].type_class) {
  case coda_record_class:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                  ,0x40f,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
  case coda_array_class:
    if (cursor->product->format != coda_format_ascii) {
      __assert_fail("cursor->product->format == coda_format_ascii",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                    ,0x339,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
    }
    iVar6 = (int)cursor->product[1].file_size;
    if (iVar6 - 1U < 2) {
      *bit_size = 8;
      return 0;
    }
    if (iVar6 != 0) {
      if (iVar6 == 3) {
        *bit_size = 0x10;
        return 0;
      }
      return 0;
    }
    if ((cursor->stack[(long)cursor->n + -1].bit_offset & 7) != 0) {
      message = "product error detected (ascii line separator does not start at byte boundary)";
      goto LAB_00148724;
    }
    iVar6 = coda_ascii_cursor_read_bytes(cursor,buffer_2,0,1);
    if (iVar6 == 0) {
      if (buffer_2[0] == '\r') {
        pcVar10 = cursor->product;
        if (1 < pcVar10->file_size - (cursor->stack[(long)cursor->n + -1].bit_offset >> 3)) {
          iVar6 = coda_ascii_cursor_read_bytes(cursor,buffer_2,1,1);
          if (iVar6 != 0) goto LAB_001483b4;
          pcVar10 = cursor->product;
          if (buffer_2[0] == '\n') {
            *bit_size = 0x10;
            uVar4 = 3;
            goto LAB_001489d8;
          }
        }
        *bit_size = 8;
        uVar4 = 2;
LAB_001489d8:
        *(undefined4 *)&pcVar10[1].file_size = uVar4;
        return 0;
      }
      if (buffer_2[0] == '\n') {
        *bit_size = 8;
        pcVar10 = cursor->product;
        uVar4 = 1;
        goto LAB_001489d8;
      }
      coda_str64(cursor->stack[(long)cursor->n + -1].bit_offset >> 3,buffer_1);
      coda_set_error(-300,
                     "product error detected (invalid end-of-line sequence - not a carriage return or linefeed character - byte offset = %s)"
                     ,buffer_1);
    }
    goto LAB_001483b4;
  case coda_integer_class:
  case coda_real_class:
    product = cursor->product;
    if (product->format != coda_format_ascii) {
      uVar15 = cursor->stack[(long)cursor->n + -1].bit_offset;
      if ((uVar15 & 7) == 0) {
        lVar13 = (long)uVar15 >> 3;
        uVar12 = product->file_size - lVar13;
        uVar19 = 0;
        uVar15 = 0;
        if (0 < (long)uVar12) {
          uVar15 = uVar12;
        }
        uVar8 = uVar12;
        for (; acVar5[0] = (char)uVar8, uVar18 = uVar15, uVar15 != uVar19; uVar19 = uVar19 + 1) {
          iVar6 = read_bytes_in_bounds(cursor->product,lVar13 + uVar19,1,buffer_1);
          if (iVar6 != 0) goto LAB_001483b4;
          uVar8 = (ulong)(byte)buffer_1[0];
          uVar18 = uVar19;
          acVar5[0] = buffer_1[0];
          if ((buffer_1[0] == '\n') || (buffer_1[0] == '\r')) break;
        }
        if (pcVar14[1].type_class != coda_integer_class) goto LAB_001488d0;
        if ((acVar5[0] == '\r') && ((long)(uVar18 + 1) < (long)uVar12)) {
          iVar6 = read_bytes_in_bounds(cursor->product,uVar18 + 1 + lVar13,1,buffer_1);
          if (iVar6 != 0) goto LAB_001483b4;
          if (buffer_1[0] == '\n') {
            uVar18 = uVar18 + 1;
          }
        }
        uVar18 = uVar18 + 1;
LAB_001488d0:
        *bit_size = uVar18 << 3;
        return 0;
      }
LAB_0014871d:
      message = "product error detected (ascii line does not start at byte boundary)";
      goto LAB_00148724;
    }
    if ((cursor->stack[(long)cursor->n + -1].bit_offset & 7) != 0) goto LAB_0014871d;
    if (product[1].root_type == (coda_dynamic_type *)0x0) {
      iVar6 = coda_ascii_init_asciilines(product);
      if (iVar6 != 0) goto LAB_001483b4;
      product = cursor->product;
    }
    if (*(long *)&product[1].format != 0) {
      lVar17 = cursor->stack[(long)cursor->n + -1].bit_offset >> 3;
      lVar13 = 0;
      lVar16 = *(long *)&product[1].format + -1;
      while (lVar11 = lVar13, lVar16 != lVar11) {
        lVar9 = (lVar16 + lVar11) / 2;
        lVar13 = lVar9 + 1;
        if (lVar17 < *(long *)(&(product[1].root_type)->backend + lVar9 * 2)) {
          lVar13 = lVar11;
          lVar16 = lVar9;
        }
      }
      lVar13 = (*(long *)(&(product[1].root_type)->backend + lVar11 * 2) - lVar17) * 8;
      *bit_size = lVar13;
      if (pcVar14[1].type_class != coda_real_class) {
        return 0;
      }
      if ((lVar11 == *(long *)&product[1].format + -1) &&
         (*(int *)&product[1].product_definition == 0)) {
        return 0;
      }
      *bit_size = lVar13 + -8;
      if ((int)product[1].file_size != 3) {
        return 0;
      }
      bit_size_boundary = lVar13 + -0x10;
LAB_001483d1:
      *bit_size = bit_size_boundary;
      return 0;
    }
    message = "trying to read from an empty file";
    iVar6 = -0x12d;
    break;
  case coda_text_class:
    uVar15 = cursor->stack[(long)cursor->n + -1].bit_offset;
    if ((uVar15 & 7) == 0) {
      lVar13 = (long)uVar15 >> 3;
      uVar15 = cursor->product->file_size - lVar13;
      uVar12 = 0;
      if ((long)uVar15 < 1) {
        uVar15 = uVar12;
      }
      for (; uVar18 = uVar15, uVar15 != uVar12; uVar12 = uVar12 + 1) {
        iVar6 = read_bytes_in_bounds(cursor->product,lVar13 + uVar12,1,buffer_1);
        if (iVar6 != 0) goto LAB_001483b4;
        if ((buffer_1[0] != ' ') && (uVar18 = uVar12, buffer_1[0] != '\t')) break;
      }
      goto LAB_001488d0;
    }
    message = "product error detected (ascii white space does not start at byte boundary)";
LAB_00148724:
    iVar6 = -300;
    break;
  default:
    goto switchD_001485c8_default;
  }
  coda_set_error(iVar6,message);
LAB_001483b4:
  iVar6 = -1;
switchD_001485c8_default:
  return iVar6;
}

Assistant:

int coda_ascii_cursor_get_bit_size(const coda_cursor *cursor, int64_t *bit_size)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    coda_ascii_mappings *mappings = NULL;
    int64_t bit_offset = cursor->stack[cursor->n - 1].bit_offset;
    int64_t bit_size_boundary;
    char buffer[MAX_ASCII_NUMBER_LENGTH];
    long buffer_size = -1;
    int use_buffer = 0;


    if (type->bit_size >= 0)
    {
        *bit_size = type->bit_size;
        return 0;
    }

    if (type->type_class == coda_record_class || type->type_class == coda_array_class)
    {
        return coda_ascbin_cursor_get_bit_size(cursor, bit_size);
    }

    if (get_bit_size_boundary(cursor, &bit_size_boundary, -1) != 0)
    {
        return -1;
    }

    /* determine if there are ascii mappings */
    if (type->type_class == coda_integer_class || type->type_class == coda_real_class)
    {
        mappings = ((coda_type_number *)type)->mappings;
        use_buffer = (mappings != NULL || type->size_expr == NULL);
    }
    else if (type->type_class == coda_text_class)
    {
        if (type->size_expr == NULL && ((coda_type_text *)type)->special_text_type == ascii_text_default)
        {
            *bit_size = bit_size_boundary;
            return 0;
        }
        use_buffer = (type->size_expr == NULL);
    }
    else if (type->type_class == coda_special_class && ((coda_type_special *)type)->special_type == coda_special_time)
    {
        coda_type *base_type = ((coda_type_special *)type)->base_type;

        assert(base_type->type_class == coda_text_class);
        if (((coda_type_text *)base_type)->special_text_type == ascii_text_default)
        {
            *bit_size = bit_size_boundary;
            return 0;
        }
    }

    /* only read buffer when we are dealing with numbers (without size_expr) or if there are mappings */
    if (use_buffer)
    {
        if (bit_size_boundary >> 3 < MAX_ASCII_NUMBER_LENGTH)
        {
            buffer_size = (long)(bit_size_boundary >> 3);
        }
        else
        {
            buffer_size = MAX_ASCII_NUMBER_LENGTH;
        }

        if (read_bytes_in_bounds(cursor->product, bit_offset >> 3, buffer_size, buffer) != 0)
        {
            return -1;
        }
    }

    if (mappings != NULL)
    {
        /* try to determine size from ascii mappings */
        /* TODO: this goes wrong if we have a mapping with a string length that exceeds MAX_ASCII_NUMBER_LENGTH
         * so we should actually also take into account the max mapping length when determining buffer_size */
        if (parse_mapping_size(buffer, buffer_size, mappings, bit_size))
        {
            return 0;
        }
    }

    if (type->type_class == coda_special_class)
    {
        coda_cursor spec_cursor;

        spec_cursor = *cursor;
        if (coda_cursor_use_base_type_of_special_type(&spec_cursor) != 0)
        {
            return -1;
        }
        return coda_cursor_get_bit_size(&spec_cursor, bit_size);
    }

    if (type->size_expr != NULL)
    {
        if (coda_expression_eval_integer(type->size_expr, cursor, bit_size) != 0)
        {
            coda_add_error_message(" for size expression");
            coda_cursor_add_to_error_message(cursor);
            return -1;
        }
        if (type->bit_size == -8)
        {
            /* convert byte size to bit size */
            *bit_size *= 8;
        }
        if (*bit_size < 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "calculated size is negative (%ld bits)", (long)*bit_size);
            coda_cursor_add_to_error_message(cursor);
            return -1;
        }
        return 0;
    }

    /* parse the data to determine the size */
    if (type->type_class == coda_integer_class || type->type_class == coda_real_class)
    {
        long size;

        switch (type->read_type)
        {
            case coda_native_type_int8:
            case coda_native_type_int16:
            case coda_native_type_int32:
            case coda_native_type_int64:
                {
                    int64_t value;

                    size = coda_ascii_parse_int64(buffer, buffer_size, &value, 1);
                }
                break;
            case coda_native_type_uint8:
            case coda_native_type_uint16:
            case coda_native_type_uint32:
            case coda_native_type_uint64:
                {
                    uint64_t value;

                    size = coda_ascii_parse_uint64(buffer, buffer_size, &value, 1);
                }
                break;
            case coda_native_type_float:
            case coda_native_type_double:
                {
                    double value;

                    size = coda_ascii_parse_double(buffer, buffer_size, &value, 1);
                }
                break;
            default:
                assert(0);
                exit(1);
        }
        if (size < 0)
        {
            return -1;
        }
        *bit_size = size * 8;
        return 0;
    }

    /* only possible case left is the special text types */
    assert(type->type_class == coda_text_class);
    switch (((coda_type_text *)type)->special_text_type)
    {
        case ascii_text_line_separator:
            assert(cursor->product->format == coda_format_ascii);
            switch (((coda_ascii_product *)cursor->product)->end_of_line)
            {
                case eol_lf:
                case eol_cr:
                    *bit_size = 8;
                    break;
                case eol_crlf:
                    *bit_size = 16;
                    break;
                case eol_unknown:
                    {
                        uint8_t buffer[1];

                        /* accept either LINEFEED, CARRIAGE_RETURN, or CARRIAGE-RETURN/LINEFEED */

                        if ((cursor->stack[cursor->n - 1].bit_offset & 0x7) != 0)
                        {
                            coda_set_error(CODA_ERROR_PRODUCT, "product error detected (ascii line separator does not "
                                           "start at byte boundary)");
                            return -1;
                        }
                        if (coda_ascii_cursor_read_bytes(cursor, buffer, 0, 1) != 0)
                        {
                            return -1;
                        }

                        switch (*buffer)
                        {
                            case '\n': /* linefeed */
                                /* just a linefeed -> unix platform convention */
                                *bit_size = 8;
                                ((coda_ascii_product *)cursor->product)->end_of_line = eol_lf;
                                break;
                            case '\r': /* carriage return */
                                if (cursor->product->file_size - (cursor->stack[cursor->n - 1].bit_offset >> 3) >= 2)
                                {
                                    if (coda_ascii_cursor_read_bytes(cursor, buffer, 1, 1) != 0)
                                    {
                                        return -1;
                                    }
                                    if (*buffer == '\n')
                                    {
                                        /* carriage return followed by linefeed -> dos platform convention */
                                        *bit_size = 16;
                                        ((coda_ascii_product *)cursor->product)->end_of_line = eol_crlf;
                                        break;
                                    }
                                }
                                /* just a carriage return -> mac platform convention */
                                *bit_size = 8;
                                ((coda_ascii_product *)cursor->product)->end_of_line = eol_cr;
                                break;
                            default:
                                {
                                    char s[21];

                                    coda_str64(cursor->stack[cursor->n - 1].bit_offset >> 3, s);
                                    coda_set_error(CODA_ERROR_PRODUCT, "product error detected (invalid end-of-line "
                                                   "sequence - not a carriage return or linefeed character - byte "
                                                   "offset = %s)", s);
                                    return -1;
                                }
                        }
                    }
            }
            break;
        case ascii_text_line_with_eol:
        case ascii_text_line_without_eol:
            if (cursor->product->format == coda_format_ascii)
            {
                int64_t byte_offset;
                long *asciiline_end_offset;
                long bottom_index;
                long top_index;

                if ((cursor->stack[cursor->n - 1].bit_offset & 0x7) != 0)
                {
                    coda_set_error(CODA_ERROR_PRODUCT,
                                   "product error detected (ascii line does not start at byte boundary)");
                    return -1;
                }

                if (((coda_ascii_product *)cursor->product)->asciiline_end_offset == NULL)
                {
                    if (coda_ascii_init_asciilines(cursor->product) != 0)
                    {
                        return -1;
                    }
                }
                if (((coda_ascii_product *)cursor->product)->num_asciilines == 0)
                {
                    coda_set_error(CODA_ERROR_OUT_OF_BOUNDS_READ, "trying to read from an empty file");
                    return -1;
                }

                bottom_index = 0;
                top_index = ((coda_ascii_product *)cursor->product)->num_asciilines - 1;
                asciiline_end_offset = ((coda_ascii_product *)cursor->product)->asciiline_end_offset;
                byte_offset = cursor->stack[cursor->n - 1].bit_offset >> 3;

                while (top_index != bottom_index)
                {
                    long index;

                    index = (bottom_index + top_index) / 2;
                    if (byte_offset < asciiline_end_offset[index])
                    {
                        top_index = index;
                    }
                    else
                    {
                        bottom_index = index + 1;
                    }
                }
                *bit_size = ((asciiline_end_offset[top_index] - byte_offset) << 3);

                /* remove length of eol if eol was not included in the asciiline type */
                /* and if the line does not end with eof */
                if (((coda_type_text *)type)->special_text_type == ascii_text_line_without_eol)
                {
                    if (!(top_index == ((coda_ascii_product *)cursor->product)->num_asciilines - 1 &&
                          ((coda_ascii_product *)cursor->product)->lastline_ending == eol_unknown))
                    {
                        *bit_size -= 8;
                        if (((coda_ascii_product *)cursor->product)->end_of_line == eol_crlf)
                        {
                            *bit_size -= 8;
                        }
                    }
                }
            }
            else
            {
                int64_t available_bytes;
                int64_t byte_offset;
                int64_t byte_size;
                char buffer[1];

                /* not a pure ascii file -> don't use asciiline cache */

                if ((cursor->stack[cursor->n - 1].bit_offset & 0x7) != 0)
                {
                    coda_set_error(CODA_ERROR_PRODUCT,
                                   "product error detected (ascii line does not start at byte boundary)");
                    return -1;
                }
                byte_offset = cursor->stack[cursor->n - 1].bit_offset >> 3;
                available_bytes = cursor->product->file_size - byte_offset;
                byte_size = 0;

                while (byte_size < available_bytes)
                {
                    if (read_bytes_in_bounds(cursor->product, byte_offset + byte_size, 1, buffer) != 0)
                    {
                        return -1;
                    }
                    if (*buffer == '\r' || *buffer == '\n')
                    {
                        break;
                    }
                    byte_size++;
                }
                if (((coda_type_text *)type)->special_text_type == ascii_text_line_with_eol)
                {
                    if (*buffer == '\r' && byte_size + 1 < available_bytes)
                    {
                        if (read_bytes_in_bounds(cursor->product, byte_offset + byte_size + 1, 1, buffer) != 0)
                        {
                            return -1;
                        }
                        if (*buffer == '\n')
                        {
                            byte_size++;
                        }
                    }
                    byte_size++;
                }
                *bit_size = (byte_size << 3);
            }
            break;
        case ascii_text_whitespace:
            {
                int64_t available_bytes;
                int64_t byte_offset;
                int64_t byte_size;
                char buffer[1];

                if ((cursor->stack[cursor->n - 1].bit_offset & 0x7) != 0)
                {
                    coda_set_error(CODA_ERROR_PRODUCT,
                                   "product error detected (ascii white space does not start at byte boundary)");
                    return -1;
                }
                byte_offset = cursor->stack[cursor->n - 1].bit_offset >> 3;
                available_bytes = cursor->product->file_size - byte_offset;
                byte_size = 0;

                while (byte_size < available_bytes)
                {
                    if (read_bytes_in_bounds(cursor->product, byte_offset + byte_size, 1, buffer) != 0)
                    {
                        return -1;
                    }
                    if (*buffer != ' ' && *buffer != '\t')
                    {
                        break;
                    }
                    byte_size++;
                }
                *bit_size = (byte_size << 3);
            }
            break;
        case ascii_text_default:
            assert(0);
            exit(1);
    }

    return 0;
}